

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O0

_Bool existsNotHaveNode(tree_t *tree,uint i)

{
  uint i_local;
  tree_t *tree_local;
  
  return (tree->haveNodeExists[(i << 1) >> 6] >> ((byte)(i << 1) & 0x3f) & 3) == 1;
}

Assistant:

static bool existsNotHaveNode(const tree_t* tree, unsigned int i) {
  return (tree->haveNodeExists[2 * i / (sizeof(bitset_word_t) * 8)] >>
              (2 * i % (sizeof(bitset_word_t) * 8)) &
          0x3) == 0x01;
}